

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

void oonf_rfc5444_send_interface_data
               (oonf_rfc5444_interface *interf,netaddr *dst,void *ptr,size_t len)

{
  ulong uVar1;
  os_interface_listener *os_interf;
  netaddr_socket sock;
  size_t len_local;
  void *ptr_local;
  netaddr *dst_local;
  oonf_rfc5444_interface *interf_local;
  undefined *local_20;
  void *local_18;
  oonf_rfc5444_interface *local_10;
  
  sock.storage.__ss_align = len;
  len_local = (size_t)ptr;
  ptr_local = dst;
  dst_local = (netaddr *)interf;
  local_10 = interf;
  netaddr_socket_init(&os_interf,dst,interf->protocol->port,
                      ((interf->_socket)._if_listener.data)->index);
  _print_packet_to_buffer
            (LOG_RFC5444_W,(netaddr_socket *)&os_interf,(oonf_rfc5444_interface *)dst_local,
             (uint8_t *)len_local,sock.storage.__ss_align,"Outgoing RFC5444 packet to",
             "Error while parsing outgoing RFC5444 packet to");
  if ((_block_output & 1U) == 0) {
    uVar1 = netaddr_is_in_subnet(&NETADDR_IPV4_MULTICAST,ptr_local);
    if (((uVar1 & 1) == 0) &&
       (uVar1 = netaddr_is_in_subnet(&NETADDR_IPV6_MULTICAST,ptr_local), (uVar1 & 1) == 0)) {
      oonf_packet_send_managed
                ((oonf_packet_managed *)(dst_local[7]._addr + 10),(netaddr_socket *)&os_interf,
                 (void *)len_local,sock.storage.__ss_align);
    }
    else {
      local_18 = ptr_local;
      oonf_packet_send_managed_multicast
                ((oonf_packet_managed *)(dst_local[7]._addr + 10),(void *)len_local,
                 sock.storage.__ss_align,(uint)*(byte *)((long)ptr_local + 0x10));
    }
  }
  else {
    local_20 = &log_global_mask;
    interf_local._4_4_ = _oonf_rfc5444_subsystem.logging;
    interf_local._0_4_ = 1;
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 1) != 0) {
      oonf_log(1,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x397,0,0,
               "Output blocked");
    }
  }
  return;
}

Assistant:

void
oonf_rfc5444_send_interface_data(
  struct oonf_rfc5444_interface *interf, const struct netaddr *dst, const void *ptr, size_t len) {
  union netaddr_socket sock;
  struct os_interface_listener *os_interf;

  os_interf = oonf_rfc5444_get_core_if_listener(interf);
  netaddr_socket_init(&sock, dst, interf->protocol->port, os_interf->data->index);

  _print_packet_to_buffer(LOG_RFC5444_W, &sock, interf, ptr, len, "Outgoing RFC5444 packet to",
    "Error while parsing outgoing RFC5444 packet to");

  if (_block_output) {
    OONF_DEBUG(LOG_RFC5444, "Output blocked");
    return;
  }

  if (netaddr_is_in_subnet(&NETADDR_IPV4_MULTICAST, dst) || netaddr_is_in_subnet(&NETADDR_IPV6_MULTICAST, dst)) {
    oonf_packet_send_managed_multicast(&interf->_socket, ptr, len, netaddr_get_address_family(dst));
  }
  else {
    oonf_packet_send_managed(&interf->_socket, &sock, ptr, len);
  }
}